

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

int Fl_Plugin_Manager::loadAll(char *filepath,char *pattern)

{
  int iVar1;
  char *filename;
  Name local_38;
  dirent *local_30;
  dirent *e;
  int n;
  int i;
  dirent **dir;
  char *pattern_local;
  char *filepath_local;
  
  dir = (dirent **)pattern;
  pattern_local = filepath;
  e._0_4_ = fl_filename_list(filepath,(dirent ***)&n,fl_numericsort);
  e._4_4_ = 0;
  do {
    if ((int)e <= e._4_4_) {
      free(_n);
      return 0;
    }
    local_30 = _n[e._4_4_];
    if (dir == (dirent **)0x0) {
LAB_0020cba7:
      Fl_Preferences::Name::Name(&local_38,"%s%s",pattern_local,local_30->d_name);
      filename = Fl_Preferences::Name::operator_cast_to_char_(&local_38);
      load(filename);
      Fl_Preferences::Name::~Name(&local_38);
    }
    else {
      iVar1 = fl_filename_match(local_30->d_name,(char *)dir);
      if (iVar1 != 0) goto LAB_0020cba7;
    }
    free(local_30);
    e._4_4_ = e._4_4_ + 1;
  } while( true );
}

Assistant:

int Fl_Plugin_Manager::loadAll(const char *filepath, const char *pattern) {
  struct dirent **dir;
  int i, n = fl_filename_list(filepath, &dir);
  for (i=0; i<n; i++) {
    struct dirent *e = dir[i];
    if (pattern==0 || fl_filename_match(e->d_name, pattern)) {
      load(Fl_Preferences::Name("%s%s", filepath, e->d_name));
    }
    free(e);
  }
  free(dir);
  return 0;
}